

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

Filter * __thiscall
helics::Federate::registerTranslator
          (Federate *this,int32_t translatorType,string_view translatorName,string_view endpointType
          ,string_view units)

{
  ConnectorFederateManager *this_00;
  Filter *this_01;
  string_view name;
  string local_48;
  
  this_00 = (this->cManager)._M_t.
            super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
            .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
  localNameGenerator_abi_cxx11_(&local_48,this,translatorName);
  name._M_str = local_48._M_dataplus._M_p;
  name._M_len = local_48._M_string_length;
  this_01 = (Filter *)ConnectorFederateManager::registerTranslator(this_00,name,endpointType,units);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  Translator::setTranslatorType((Translator *)this_01,translatorType);
  return this_01;
}

Assistant:

Translator& Federate::registerTranslator(std::int32_t translatorType,
                                         std::string_view translatorName,
                                         std::string_view endpointType,
                                         std::string_view units)
{
    Translator& trans =
        cManager->registerTranslator(localNameGenerator(translatorName), endpointType, units);
    trans.setTranslatorType(translatorType);
    return trans;
}